

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompPredicate(xmlXPathParserContextPtr ctxt,int filter)

{
  int ch1;
  bool bVar1;
  int op1;
  int filter_local;
  xmlXPathParserContextPtr ctxt_local;
  
  ch1 = ctxt->comp->last;
  while( true ) {
    bVar1 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
      bVar1 = *ctxt->cur == '\r';
    }
    if (!bVar1) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '[') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    ctxt->comp->last = -1;
    if (filter == 0) {
      xmlXPathCompileExpr(ctxt,0);
    }
    else {
      xmlXPathCompileExpr(ctxt,1);
    }
    if (ctxt->error == 0) {
      if (*ctxt->cur == ']') {
        if (filter == 0) {
          xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_PREDICATE,0,0,0,(void *)0x0,
                              (void *)0x0);
        }
        else {
          xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_FILTER,0,0,0,(void *)0x0,
                              (void *)0x0);
        }
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        while( true ) {
          bVar1 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
            bVar1 = *ctxt->cur == '\r';
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
      }
      else {
        xmlXPathErr(ctxt,6);
      }
    }
  }
  else {
    xmlXPathErr(ctxt,6);
  }
  return;
}

Assistant:

static void
xmlXPathCompPredicate(xmlXPathParserContextPtr ctxt, int filter) {
    int op1 = ctxt->comp->last;

    SKIP_BLANKS;
    if (CUR != '[') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    ctxt->comp->last = -1;
    /*
    * This call to xmlXPathCompileExpr() will deactivate sorting
    * of the predicate result.
    * TODO: Sorting is still activated for filters, since I'm not
    *  sure if needed. Normally sorting should not be needed, since
    *  a filter can only diminish the number of items in a sequence,
    *  but won't change its order; so if the initial sequence is sorted,
    *  subsequent sorting is not needed.
    */
    if (! filter)
	xmlXPathCompileExpr(ctxt, 0);
    else
	xmlXPathCompileExpr(ctxt, 1);
    CHECK_ERROR;

    if (CUR != ']') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }

    if (filter)
	PUSH_BINARY_EXPR(XPATH_OP_FILTER, op1, ctxt->comp->last, 0, 0);
    else
	PUSH_BINARY_EXPR(XPATH_OP_PREDICATE, op1, ctxt->comp->last, 0, 0);

    NEXT;
    SKIP_BLANKS;
}